

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

void __thiscall CLI::App::_process(App *this)

{
  _process_help_flags(this,false,false);
  _process_config_file(this);
  _process_env(this);
  _process_callbacks(this);
  _process_requirements(this);
  return;
}

Assistant:

CLI11_INLINE void App::_process() {
    // help takes precedence over other potential errors and config and environment shouldn't be processed if help
    // throws
    _process_help_flags();
    try {
        // the config file might generate a FileError but that should not be processed until later in the process
        // to allow for help, version and other errors to generate first.
        _process_config_file();

        // process env shouldn't throw but no reason to process it if config generated an error
        _process_env();
    } catch(const CLI::FileError &) {
        // callbacks can generate exceptions which should take priority
        // over the config file error if one exists.
        _process_callbacks();
        throw;
    }

    _process_callbacks();

    _process_requirements();
}